

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

char * __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::PrintFractionalDigitsFast
          (anon_unknown_0 *this,uint128 v,char *start,int exp,size_t precision)

{
  char cVar1;
  int amount;
  undefined4 in_register_00000084;
  uint128 lhs;
  unsigned_long uStack_80;
  char carry;
  uint64_t low;
  uint64_t local_70;
  uint128 local_68;
  unsigned_long local_50;
  uint64_t high;
  char *p;
  size_t precision_local;
  uint64_t uStack_30;
  int exp_local;
  char *start_local;
  uint128 v_local;
  
  amount = (int)start;
  high = v.hi_;
  v_local.lo_ = v.lo_;
  p = (char *)CONCAT44(in_register_00000084,exp);
  precision_local._4_4_ = amount;
  uStack_30 = high;
  start_local = (char *)this;
  uint128::operator<<=((uint128 *)&start_local,0x80 - amount);
  low = (uint64_t)start_local;
  local_70 = v_local.lo_;
  lhs.hi_ = 0x40;
  lhs.lo_ = v_local.lo_;
  local_68 = operator>>((lts_20250127 *)start_local,lhs,amount);
  local_50 = uint128::operator_cast_to_unsigned_long(&local_68);
  uStack_80 = uint128::operator_cast_to_unsigned_long((uint128 *)&start_local);
  for (; p != (char *)0x0 && uStack_80 != 0; p = p + -1) {
    cVar1 = MultiplyBy10WithCarry<unsigned_long>(&stack0xffffffffffffff80,'\0');
    cVar1 = MultiplyBy10WithCarry<unsigned_long>(&local_50,cVar1);
    *(char *)high = cVar1 + '0';
    high = high + 1;
  }
  while( true ) {
    if (p == (char *)0x0) {
      if (0x7fffffffffffffff < local_50) {
        if ((local_50 < 0x8000000000000001) && (uStack_80 == 0)) {
          RoundToEven((char *)(high - 1));
        }
        else {
          RoundUp((char *)(high - 1));
        }
      }
      return (char *)high;
    }
    if (local_50 == 0) break;
    cVar1 = MultiplyBy10WithCarry<unsigned_long>(&local_50,'\0');
    *(char *)high = cVar1 + '0';
    p = p + -1;
    high = high + 1;
  }
  return (char *)high;
}

Assistant:

char* PrintFractionalDigitsFast(uint128 v,
                                char* start,
                                int exp,
                                size_t precision) {
  char *p = start;
  v <<= (128 - exp);
  auto high = static_cast<uint64_t>(v >> 64);
  auto low = static_cast<uint64_t>(v);

  // While we have digits to print and `low` is not empty, do the long
  // multiplication.
  while (precision > 0 && low != 0) {
    char carry = MultiplyBy10WithCarry(&low, 0);
    carry = MultiplyBy10WithCarry(&high, carry);

    *p++ = carry + '0';
    --precision;
  }

  // Now `low` is empty, so use a faster approach for the rest of the digits.
  // This block is pretty much the same as the main loop for the 64-bit case
  // above.
  while (precision > 0) {
    if (!high) return p;
    *p++ = MultiplyBy10WithCarry(&high, 0) + '0';
    --precision;
  }

  // We need to round.
  if (high < 0x8000000000000000) {
    // We round down, so nothing to do.
  } else if (high > 0x8000000000000000 || low != 0) {
    // We round up.
    RoundUp(p - 1);
  } else {
    RoundToEven(p - 1);
  }

  return p;
}